

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_etc.c
# Opt level: O3

word zzSubAndW(word *b,word *a,size_t n,word w)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  if (n != 0) {
    sVar5 = 0;
    uVar4 = 0;
    do {
      uVar3 = a[sVar5];
      uVar6 = (uVar3 & w) + uVar4;
      puVar1 = b + sVar5;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 - uVar6;
      uVar4 = (ulong)(uVar2 < uVar6 || CARRY8(uVar3 & w,uVar4));
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
    return uVar4;
  }
  return 0;
}

Assistant:

word zzSubAndW(word b[], const word a[], size_t n, register word w)
{
	register word borrow = 0;
	register word prod;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
		prod = w & a[i];
		prod += borrow;
		borrow = wordLess01(prod, borrow);
		borrow |= wordLess01(b[i], prod);
		b[i] -= prod;
	}
	prod = w = 0;
	return borrow;
}